

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void DumpLiteral(SQObjectPtr *o)

{
  SQObjectType SVar1;
  SQChar *pSVar2;
  char *pcVar3;
  SQObjectPtr *o_local;
  
  SVar1 = (o->super_SQObject)._type;
  if (SVar1 == OT_BOOL) {
    pcVar3 = "false";
    if ((o->super_SQObject)._unVal.pTable != (SQTable *)0x0) {
      pcVar3 = "true";
    }
    printf("%s",pcVar3);
  }
  else if (SVar1 == OT_INTEGER) {
    printf("{%lld}",(o->super_SQObject)._unVal.pTable);
  }
  else if (SVar1 == OT_FLOAT) {
    printf("{%f}",(double)(o->super_SQObject)._unVal.fFloat);
  }
  else if (SVar1 == OT_STRING) {
    printf("\"%s\"",&((o->super_SQObject)._unVal.pTable)->_firstfree);
  }
  else {
    pSVar2 = GetTypeName(o);
    printf("(%s %p)",pSVar2,(o->super_SQObject)._unVal.pTable);
  }
  return;
}

Assistant:

void DumpLiteral(SQObjectPtr &o)
{
    switch(type(o)){
        case OT_STRING: scprintf(_SC("\"%s\""),_stringval(o));break;
        case OT_FLOAT: scprintf(_SC("{%f}"),_float(o));break;
        case OT_INTEGER: scprintf(_SC("{") _PRINT_INT_FMT _SC("}"),_integer(o));break;
        case OT_BOOL: scprintf(_SC("%s"),_integer(o)?_SC("true"):_SC("false"));break;
        default: scprintf(_SC("(%s %p)"),GetTypeName(o),(void*)_rawval(o));break; break; //shut up compiler
    }
}